

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelapsedtimer.cpp
# Opt level: O0

void __thiscall QElapsedTimer::start(QElapsedTimer *this)

{
  rep rVar1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  TimePoint now;
  duration<long,_std::ratio<1L,_1000000000L>_> local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = (undefined1 *)std::chrono::_V2::steady_clock::now();
  local_18.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(in_RDI);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_18);
  (in_RDI->__d).__r = rVar1;
  in_RDI[1].__d.__r = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QElapsedTimer::start() noexcept
{
    static_assert(sizeof(t1) == sizeof(Duration::rep));

    // This assignment will work so long as TimePoint uses the same time
    // duration or one of finer granularity than steady_clock::time_point. That
    // means it will work until the first steady_clock using picoseconds.
    TimePoint now = std::chrono::steady_clock::now();
    t1 = now.time_since_epoch().count();
    QT6_ONLY(t2 = 0);
}